

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  undefined1 *this_00;
  char *pcVar1;
  int iVar2;
  cmGeneratedFileStream *this_01;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined1 uVar4;
  stringstream mainFileBuffer;
  stringstream mainFileWithHeadersAndFootersBuffer;
  string local_360;
  long *local_340;
  long local_338;
  long local_330;
  streambuf local_328 [104];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [112];
  ios_base local_148 [16];
  ios_base aiStack_138 [264];
  
  if (this->AppendMode == true) {
    pcVar1 = (this->MainImportFile)._M_dataplus._M_p;
    this_01 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(this_01,pcVar1,_S_app);
  }
  else {
    this_01 = (cmGeneratedFileStream *)operator_new(0x268);
    cmGeneratedFileStream::cmGeneratedFileStream(this_01,&this->MainImportFile,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(this_01,true);
  }
  if (((&(this_01->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this_01->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
    this_00 = local_1b8 + 0x10;
    (*this->_vptr_cmExportFileGenerator[4])(this,this_00,&local_340);
    if (local_340 != &local_330) {
      operator_delete(local_340,local_330 + 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
    iVar2 = (*this->_vptr_cmExportFileGenerator[0xd])(this,&local_330);
    uVar4 = (undefined1)iVar2;
    if (this->AppendMode == false) {
      iVar2 = (*this->_vptr_cmExportFileGenerator[0x13])(this);
      if ((CONCAT44(extraout_var,iVar2) != 0) && (this->ExportPackageDependencies == true)) {
        if ((ulong)(this->RequiredCMakeVersionPatch % 100000000) +
            ((ulong)(this->RequiredCMakeVersionMinor % 1000) +
            (ulong)(this->RequiredCMakeVersionMajor * 1000)) * 100000000 >> 8 < 0x460f09a1) {
          this->RequiredCMakeVersionMajor = 3;
          this->RequiredCMakeVersionMinor = 9;
          this->RequiredCMakeVersionPatch = 0;
        }
        (*this->_vptr_cmExportFileGenerator[0xb])(this,this_00);
      }
    }
    std::ostream::operator<<(this_00,local_328);
    (*this->_vptr_cmExportFileGenerator[5])(this,this_00);
    (*this->_vptr_cmExportFileGenerator[3])(this,this_00);
    (*this->_vptr_cmExportFileGenerator[2])(this,this_01);
    std::ostream::operator<<(this_01,(streambuf *)(local_1b8 + 0x18));
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(aiStack_138);
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"cannot write to file \"",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1b8,(this->MainImportFile)._M_dataplus._M_p,
                        (this->MainImportFile)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_340,local_338);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
    if (local_340 != &local_330) {
      operator_delete(local_340,local_330 + 1);
    }
    uVar4 = 0;
  }
  (*(this_01->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])(this_01);
  return (bool)uVar4;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->AppendMode) {
    // Open for append.
    auto openmodeApp = std::ios::app;
    foutPtr = cm::make_unique<cmsys::ofstream>(this->MainImportFile.c_str(),
                                               openmodeApp);
  } else {
    // Generate atomically and with copy-if-different.
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->MainImportFile, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  if (!foutPtr || !*foutPtr) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  std::ostream& os = *foutPtr;
  std::stringstream mainFileWithHeadersAndFootersBuffer;

  // Start with the import file header.
  this->GenerateImportHeaderCode(mainFileWithHeadersAndFootersBuffer);

  // Create all the imported targets.
  std::stringstream mainFileBuffer;
  bool result = this->GenerateMainFile(mainFileBuffer);

  // Export find_dependency() calls. Must be done after GenerateMainFile(),
  // because that's when target dependencies are gathered, which we need for
  // the find_dependency() calls.
  if (!this->AppendMode && this->GetExportSet() &&
      this->ExportPackageDependencies) {
    this->SetRequiredCMakeVersion(3, 9, 0);
    this->GenerateFindDependencyCalls(mainFileWithHeadersAndFootersBuffer);
  }

  // Write cached import code.
  mainFileWithHeadersAndFootersBuffer << mainFileBuffer.rdbuf();

  // End with the import file footer.
  this->GenerateImportFooterCode(mainFileWithHeadersAndFootersBuffer);
  this->GeneratePolicyFooterCode(mainFileWithHeadersAndFootersBuffer);

  // This has to be done last, after the minimum CMake version has been
  // determined.
  this->GeneratePolicyHeaderCode(os);
  os << mainFileWithHeadersAndFootersBuffer.rdbuf();

  return result;
}